

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O3

void file_handle_open(t_file_handle *x,t_symbol *file,t_symbol *smode)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  t_file_handle *ptVar4;
  int *piVar5;
  char *pcVar6;
  t_file_handler *ptVar7;
  t_symbol *extraout_RDX;
  t_symbol *ptVar8;
  _outlet *x_00;
  uint uVar9;
  stat_conflict sb;
  stat asStack_428 [7];
  
  if (-1 < x->x_fhptr->fh_fd) {
    pd_error(x,"\'open\' without prior \'close\'");
    return;
  }
  ptVar4 = x;
  ptVar8 = smode;
  if ((x->x_fcname != (t_symbol *)0x0) &&
     (ptVar4 = (t_file_handle *)pd_findbyclass(x->x_fcname,file_define_class), ptVar8 = extraout_RDX
     , ptVar4 == (t_file_handle *)0x0)) {
    pd_error(x,"file handle: couldn\'t find file-define \'%s\'",x->x_fcname->s_name);
    return;
  }
  x->x_fhptr = &ptVar4->x_fh;
  uVar9 = 0;
  if (smode != &s_ && smode != (t_symbol *)0x0) {
    cVar1 = *smode->s_name;
    if (cVar1 == 'a') {
      uVar9 = 0x401;
    }
    else if (cVar1 == 'c') {
      uVar9 = 0x201;
    }
    else {
      uVar9 = 0;
      if (cVar1 == 'w') {
        uVar9 = 1;
      }
    }
  }
  pcVar2 = file->s_name;
  do_expandpath(pcVar2,(char *)asStack_428,(int)ptVar8);
  iVar3 = sys_open((char *)asStack_428,(uVar9 & 1) << 6 | uVar9,(ulong)x->x_creationmode);
  ptVar7 = x->x_fhptr;
  ptVar7->fh_fd = iVar3;
  if (iVar3 < 0) {
    if (x->x_verbose != 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pd_error(x,"unable to open \'%s\': %s",pcVar2,pcVar6);
    }
    x_00 = x->x_infoout;
    if (x_00 == (_outlet *)0x0) {
      return;
    }
  }
  else {
    iVar3 = fstat(ptVar7->fh_fd,asStack_428);
    if (iVar3 == 0) {
      if ((asStack_428[0].st_mode & 0xf000) != 0x4000) {
        x->x_fhptr->fh_mode = uVar9 & 1;
        return;
      }
      ptVar7 = x->x_fhptr;
      if (-1 < ptVar7->fh_fd) {
        sys_close(ptVar7->fh_fd);
        ptVar7 = x->x_fhptr;
      }
      ptVar7->fh_fd = -1;
      if (x->x_verbose != 0) {
        pd_error(x,"unable to open directory \'%s\' as file",file->s_name);
      }
    }
    else {
      ptVar7 = x->x_fhptr;
      if (-1 < ptVar7->fh_fd) {
        sys_close(ptVar7->fh_fd);
        ptVar7 = x->x_fhptr;
      }
      ptVar7->fh_fd = -1;
      if (x->x_verbose != 0) {
        pcVar2 = file->s_name;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        pd_error(x,"unable to stat \'%s\': %s",pcVar2,pcVar6);
      }
    }
    x_00 = x->x_infoout;
  }
  outlet_bang(x_00);
  return;
}

Assistant:

static void file_handle_open(t_file_handle*x, t_symbol*file, t_symbol*smode) {
    int mode = O_RDONLY;
    if (x->x_fd>=0) {
        pd_error(x, "'open' without prior 'close'");
        return;
    }
    if(!file_handle_getdefine(x)) {
        pd_error(x, "file handle: couldn't find file-define '%s'", x->x_fcname->s_name);
        return;
    }
    if(smode && smode!=&s_) {
        switch(smode->s_name[0]) {
        case 'r': /* read */
            mode = O_RDONLY;
            break;
        case 'w': /* write */
            mode = O_WRONLY;
            break;
        case 'a': /* append */
            mode = O_WRONLY | O_APPEND;
            break;
        case 'c': /* create */
            mode = O_WRONLY | O_TRUNC;
            break;
        }
    }
    if(mode & O_WRONLY) {
        mode |= O_CREAT;
    }
    if(do_file_open(x, file->s_name, mode)>=0) {
            /* check if we haven't accidentally opened a directory */
        struct stat sb;
        if(fstat(x->x_fd, &sb)) {
            file_handle_close(x);
            if(x->x_verbose)
                pd_error(x, "unable to stat '%s': %s", file->s_name, strerror(errno));
            outlet_bang(x->x_infoout);
            return;
        }
        if(S_ISDIR(sb.st_mode)) {
            file_handle_close(x);
            if(x->x_verbose)
                pd_error(x, "unable to open directory '%s' as file", file->s_name);
            outlet_bang(x->x_infoout);
            return;
        }
        x->x_mode = (mode&O_WRONLY)?1:0;
    }
}